

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMAddress.cpp
# Opt level: O3

ostream * operator<<(ostream *stream,ROMAddress *addr)

{
  undefined4 uVar1;
  long lVar2;
  ostream *poVar3;
  
  lVar2 = *(long *)stream;
  uVar1 = *(undefined4 *)(stream + *(long *)(lVar2 + -0x18) + 0x18);
  *(undefined4 *)(stream + *(long *)(lVar2 + -0x18) + 0x18) = 8;
  poVar3 = stream + *(long *)(lVar2 + -0x18);
  if (stream[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar3);
    poVar3[0xe1] = (ostream)0x1;
    lVar2 = *(long *)stream;
  }
  poVar3[0xe0] = (ostream)0x30;
  *(uint *)(stream + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(stream + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
  *(undefined8 *)(stream + *(long *)(lVar2 + -0x18) + 0x10) = 2;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  *(undefined4 *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) = uVar1;
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream &stream, const ROMAddress &addr) {
    auto flags = stream.flags(std::ios_base::hex);
    //so the address gets shown as big-endian no matter if the system is little-, middle- or big-endian
    stream << std::setfill('0') << std::uppercase << std::setw(2) << static_cast<uint16_t>(addr.bank()) << ":" << std::setw(4) << addr.bankAddress();
    stream.flags(flags);
    return stream;
}